

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O0

MPP_RET mpp_service_attach_fd(void *ctx,MppDevBufMapNode *node)

{
  MPP_RET MVar1;
  MPP_RET ret;
  MppDevMppService *p;
  MppDevBufMapNode *node_local;
  void *ctx_local;
  
  if ((node->buffer == (MppBuffer)0x0) &&
     (_mpp_log_l(2,"mpp_serivce","Assertion %s failed at %s:%d\n",(char *)0x0,"node->buffer",
                 "mpp_service_attach_fd",0x2a1), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((node->lock_buf == (pthread_mutex_t *)0x0) &&
     (_mpp_log_l(2,"mpp_serivce","Assertion %s failed at %s:%d\n",(char *)0x0,"node->lock_buf",
                 "mpp_service_attach_fd",0x2a2), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((node->buf_fd < 0) &&
     (_mpp_log_l(2,"mpp_serivce","Assertion %s failed at %s:%d\n",(char *)0x0,"node->buf_fd >= 0",
                 "mpp_service_attach_fd",0x2a3), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  node->lock_dev = (pthread_mutex_t *)((long)ctx + 0x198);
  node->dev_fd = *(RK_S32 *)((long)ctx + 4);
  MVar1 = mpp_service_ioc_attach_fd(node);
  if (MVar1 == MPP_OK) {
    list_add_tail(&node->list_dev,(list_head *)((long)ctx + 0x1c0));
  }
  else {
    node->lock_dev = (pthread_mutex_t *)0x0;
    node->dev_fd = -1;
    list_del_init(&node->list_dev);
  }
  if ((mpp_device_debug & 0x80) != 0) {
    _mpp_log_l(4,"mpp_serivce","node %p dev %d attach fd %d iova %x\n",(char *)0x0,node,
               (ulong)(uint)node->dev_fd,node->buf_fd,node->iova);
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_service_attach_fd(void *ctx, MppDevBufMapNode *node)
{
    MppDevMppService *p = (MppDevMppService *)ctx;
    MPP_RET ret;

    mpp_assert(node->buffer);
    mpp_assert(node->lock_buf);
    mpp_assert(node->buf_fd >= 0);

    node->lock_dev = &p->lock_bufs;
    node->dev_fd = p->client;
    ret = mpp_service_ioc_attach_fd(node);
    if (ret) {
        node->lock_dev = NULL;
        node->dev_fd = -1;
        list_del_init(&node->list_dev);
    } else {
        list_add_tail(&node->list_dev, &p->list_bufs);
    }

    mpp_dev_dbg_buf("node %p dev %d attach fd %d iova %x\n",
                    node, node->dev_fd, node->buf_fd, node->iova);

    return ret;
}